

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void blend_untransformed_argb(int count,QT_FT_Span *spans,void *userData)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QThreadPool *pQVar5;
  ulong uVar6;
  QT_FT_Span *in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  int cn;
  int i;
  int c;
  QThreadPool *threadPool;
  int segments;
  int yoff;
  int xoff;
  int const_alpha;
  int image_height;
  int image_width;
  QSpanData *data;
  QSemaphore semaphore;
  anon_class_48_8_668f4b82 function;
  Operator op;
  undefined4 in_stack_fffffffffffffea8;
  int iVar7;
  int iVar8;
  int in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined1 *local_f0;
  undefined1 *local_e8 [2];
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  undefined1 local_b8 [176];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDX[0xd].x == 6) || (in_RDX[0xd].x == 4)) {
    memcpy(local_b8,&DAT_00bfd450,0xb0);
    getOperator((QSpanData *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                (QT_FT_Span *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                in_stack_fffffffffffffec4);
    iVar8 = in_RDX[0xb].x;
    iVar7 = in_RDX[0xb].len;
    iVar4 = in_RDX[0xe].y;
    iVar1 = qRound(5.84440084371963e-317);
    iVar1 = -iVar1;
    iVar2 = qRound(5.84442455887063e-317);
    iVar2 = -iVar2;
    memset(local_e8,0xaa,0x30);
    local_e8[0] = local_b8;
    iVar3 = (in_EDI + 0x20) / 0x40;
    local_d8 = iVar1;
    local_d4 = iVar2;
    local_d0 = iVar7;
    local_cc = iVar8;
    local_c8 = iVar4;
    pQVar5 = QGuiApplicationPrivate::qtGuiThreadPool();
    if ((1 < iVar3) &&
       ((2 < (int)qPixelLayouts[*(uint *)(*(long *)in_RDX + 0x10)].bpp &&
        (pQVar5 != (QThreadPool *)0x0)))) {
      QThread::currentThread();
      uVar6 = QThreadPool::contains((QThread *)pQVar5);
      if ((uVar6 & 1) == 0) {
        local_f0 = &DAT_aaaaaaaaaaaaaaaa;
        QSemaphore::QSemaphore((QSemaphore *)&local_f0,0);
        iVar8 = 0;
        for (iVar7 = 0; iVar7 < iVar3; iVar7 = iVar7 + 1) {
          iVar4 = (in_EDI - iVar8) / (iVar3 - iVar7);
          QThreadPool::
          start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_gui_painting_qdrawhelper_cpp:4572:5),_true>
                    ((QThreadPool *)CONCAT44(iVar8,iVar7),
                     (anon_class_24_4_b418dff8_for_o *)CONCAT44(iVar4,in_stack_fffffffffffffea8),
                     (int)((ulong)pQVar5 >> 0x20));
          iVar8 = iVar4 + iVar8;
        }
        QSemaphore::acquire((int)&local_f0);
        QSemaphore::~QSemaphore((QSemaphore *)&local_f0);
        goto LAB_00b481c8;
      }
    }
    blend_untransformed_argb::anon_class_48_8_668f4b82::operator()
              ((anon_class_48_8_668f4b82 *)CONCAT44(iVar8,iVar7),iVar4,iVar1);
  }
  else {
    blend_untransformed_generic((int)((ulong)in_RSI >> 0x20),in_RDX,in_RDX);
  }
LAB_00b481c8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blend_untransformed_argb(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);
    if (data->texture.format != QImage::Format_ARGB32_Premultiplied
        && data->texture.format != QImage::Format_RGB32) {
        blend_untransformed_generic(count, spans, userData);
        return;
    }

    const Operator op = getOperator(data, spans, count);

    const int image_width = data->texture.width;
    const int image_height = data->texture.height;
    const int const_alpha = data->texture.const_alpha;
    const int xoff = -qRound(-data->dx);
    const int yoff = -qRound(-data->dy);

    auto function = [=, &op] (int cStart, int cEnd)
    {
        for (int c = cStart; c < cEnd; ++c) {
            if (!spans[c].len)
                continue;
            int x = spans[c].x;
            int length = spans[c].len;
            int sx = xoff + x;
            int sy = yoff + spans[c].y;
            if (sy >= 0 && sy < image_height && sx < image_width) {
                if (sx < 0) {
                    x -= sx;
                    length += sx;
                    sx = 0;
                }
                if (sx + length > image_width)
                    length = image_width - sx;
                if (length > 0) {
                    const int coverage = (spans[c].coverage * const_alpha) >> 8;
                    const uint *src = (const uint *)data->texture.scanLine(sy) + sx;
                    uint *dest = ((uint *)data->rasterBuffer->scanLine(spans[c].y)) + x;
                    op.func(dest, src, length, coverage);
                }
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}